

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaD_reallocCI(lua_State *L,int newsize)

{
  CallInfo *block;
  CallInfo *pCVar1;
  
  if (-2 < newsize) {
    block = L->base_ci;
    pCVar1 = (CallInfo *)luaM_realloc_(L,block,(long)L->size_ci * 0x28,(long)newsize * 0x28);
    L->base_ci = pCVar1;
    L->size_ci = newsize;
    L->ci = (CallInfo *)(((long)L->ci - (long)block) + (long)pCVar1);
    L->end_ci = pCVar1 + (long)newsize + -1;
    return;
  }
  luaG_runerror(L,"memory allocation error: block too big");
}

Assistant:

static void luaD_reallocCI(lua_State*L,int newsize){
CallInfo*oldci=L->base_ci;
luaM_reallocvector(L,L->base_ci,L->size_ci,newsize,CallInfo);
L->size_ci=newsize;
L->ci=(L->ci-oldci)+L->base_ci;
L->end_ci=L->base_ci+L->size_ci-1;
}